

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZKrylovEigenSolver.h
# Opt level: O0

void __thiscall TPZKrylovEigenSolver<float>::SetKrylovDim(TPZKrylovEigenSolver<float> *this,int k)

{
  ostream *this_00;
  void *this_01;
  int in_ESI;
  long in_RDI;
  int local_c;
  
  local_c = in_ESI;
  if (in_ESI < 2) {
    local_c = 2;
    this_00 = std::operator<<((ostream *)&std::cout,"Adjusted Krylov dim to ");
    this_01 = (void *)std::ostream::operator<<(this_00,2);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  *(int *)(in_RDI + 0xd8) = local_c;
  return;
}

Assistant:

void TPZKrylovEigenSolver<TVar>::SetKrylovDim(int k)
{
  if(k<2){
    k = 2;
    std::cout<< "Adjusted Krylov dim to "<< k<<std::endl;
  }
  fKrylovDim = k;
}